

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-adapter.cpp
# Opt level: O0

llama_adapter_lora * llama_adapter_lora_init(llama_model *model,char *path_lora)

{
  llama_adapter_lora *this;
  exception *err;
  llama_adapter_lora *adapter;
  llama_adapter_lora *in_stack_000008e0;
  char *in_stack_000008e8;
  llama_model *in_stack_000008f0;
  
  this = (llama_adapter_lora *)operator_new(0x70);
  (this->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&this->alpha = 0;
  (this->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bufs).
  super__Vector_base<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>,_std::allocator<std::unique_ptr<ggml_backend_buffer,_ggml_backend_buffer_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ab_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ctxs).
  super__Vector_base<std::unique_ptr<ggml_context,_ggml_context_deleter>,_std::allocator<std::unique_ptr<ggml_context,_ggml_context_deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)&(this->ab_map)._M_h._M_rehash_policy = 0;
  (this->ab_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ab_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ab_map)._M_h._M_element_count = 0;
  (this->ab_map)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->ab_map)._M_h._M_bucket_count = 0;
  llama_adapter_lora::llama_adapter_lora(this);
  llama_adapter_lora_init_impl(in_stack_000008f0,in_stack_000008e8,in_stack_000008e0);
  return this;
}

Assistant:

llama_adapter_lora * llama_adapter_lora_init(llama_model * model, const char * path_lora) {
    llama_adapter_lora * adapter = new llama_adapter_lora();

    try {
        llama_adapter_lora_init_impl(*model, path_lora, *adapter);
        return adapter;
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: failed to apply lora adapter: %s\n", __func__, err.what());

        delete adapter;
    }

    return nullptr;
}